

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

bool __thiscall GGSock::FileServer::Impl::exists(Impl *this,FileInfo *info)

{
  pointer pFVar1;
  _Bit_type *p_Var2;
  pointer __s1;
  size_t __n;
  size_t sVar3;
  size_t __n_00;
  pointer __s1_00;
  int iVar4;
  size_type *psVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  pFVar1 = (this->files).
           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (int)((long)(this->files).
                      super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 3) * -0x3b13b13b;
  bVar8 = 0 < (int)uVar6;
  if (0 < (int)uVar6) {
    p_Var2 = (this->fileUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __s1 = (info->uri)._M_dataplus._M_p;
    __n = (info->uri)._M_string_length;
    sVar3 = info->filesize;
    __n_00 = (info->filename)._M_string_length;
    __s1_00 = (info->filename)._M_dataplus._M_p;
    psVar5 = &(pFVar1->info).filename._M_string_length;
    uVar7 = 0;
    do {
      if (((((p_Var2[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) && (__n == psVar5[-5])) &&
          ((__n == 0 || (iVar4 = bcmp(__s1,(void *)psVar5[-6],__n), iVar4 == 0)))) &&
         ((sVar3 == psVar5[-2] && (__n_00 == *psVar5)))) {
        if (__n_00 == 0) {
          return bVar8;
        }
        iVar4 = bcmp(__s1_00,(((TFilename *)(psVar5 + -1))->_M_dataplus)._M_p,__n_00);
        if (iVar4 == 0) {
          return bVar8;
        }
      }
      uVar7 = uVar7 + 1;
      bVar8 = uVar7 < (uVar6 & 0x7fffffff);
      psVar5 = psVar5 + 0xd;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  return bVar8;
}

Assistant:

bool exists(const FileInfo & info) const {
        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }

            const auto & file = files[i];
            if (info.uri == file.info.uri &&
                info.filesize == file.info.filesize &&
                info.filename == file.info.filename) {
                return true;
            }
        }

        return false;
    }